

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall Lodtalk::GarbageCollector::~GarbageCollector(GarbageCollector *this)

{
  pointer ppSVar1;
  pointer pOVar2;
  pointer ppVar3;
  
  ppSVar1 = (this->currentStacks).
            super__Vector_base<Lodtalk::StackMemory_*,_std::allocator<Lodtalk::StackMemory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1);
  }
  pOVar2 = (this->nativeObjects).super__Vector_base<Lodtalk::Oop,_std::allocator<Lodtalk::Oop>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pOVar2 != (pointer)0x0) {
    operator_delete(pOVar2);
  }
  ppVar3 = (this->rootPointers).
           super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 != (pointer)0x0) {
    operator_delete(ppVar3);
    return;
  }
  return;
}

Assistant:

GarbageCollector::~GarbageCollector()
{
}